

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetCreateRuleVariable
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  bool bVar1;
  TargetType TVar2;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  uint local_e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  byte local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string var;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *this_local;
  string *linkExeWithExports;
  
  var.field_2._8_8_ = config;
  TVar2 = GetType(this);
  switch(TVar2) {
  case EXECUTABLE:
    bVar1 = IsExecutableWithExports(this);
    if (bVar1) {
      local_b9 = 0;
      std::operator+(&local_e0,"CMAKE_",lang);
      std::operator+(__return_storage_ptr__,&local_e0,"_LINK_EXECUTABLE_WITH_EXPORTS");
      std::__cxx11::string::~string((string *)&local_e0);
      bVar1 = cmMakefile::IsDefinitionSet(this->Makefile,__return_storage_ptr__);
      if (bVar1) {
        local_b9 = 1;
      }
      local_e4 = (uint)bVar1;
      if ((local_b9 & 1) == 0) {
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      if (local_e4 != 0) {
        return __return_storage_ptr__;
      }
    }
    std::operator+(&local_108,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&local_108,"_LINK_EXECUTABLE");
    std::__cxx11::string::~string((string *)&local_108);
    break;
  case STATIC_LIBRARY:
    std::operator+(&local_68,"CMAKE_",lang);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68,"_CREATE_STATIC_LIBRARY");
    std::__cxx11::string::~string((string *)&local_68);
    GetFeatureSpecificLinkRuleVariable
              (__return_storage_ptr__,this,(string *)local_48,lang,(string *)var.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_48);
    break;
  case SHARED_LIBRARY:
    std::operator+(&local_98,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&local_98,"_CREATE_SHARED_LIBRARY");
    std::__cxx11::string::~string((string *)&local_98);
    break;
  case MODULE_LIBRARY:
    std::operator+(&local_b8,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&local_b8,"_CREATE_SHARED_MODULE");
    std::__cxx11::string::~string((string *)&local_b8);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_109);
    std::allocator<char>::~allocator(&local_109);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCreateRuleVariable(
  std::string const& lang, std::string const& config) const
{
  switch (this->GetType()) {
    case cmStateEnums::STATIC_LIBRARY: {
      std::string var = "CMAKE_" + lang + "_CREATE_STATIC_LIBRARY";
      return this->GetFeatureSpecificLinkRuleVariable(var, lang, config);
    }
    case cmStateEnums::SHARED_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_LIBRARY";
    case cmStateEnums::MODULE_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_MODULE";
    case cmStateEnums::EXECUTABLE:
      if (this->IsExecutableWithExports()) {
        std::string linkExeWithExports =
          "CMAKE_" + lang + "_LINK_EXECUTABLE_WITH_EXPORTS";
        if (this->Makefile->IsDefinitionSet(linkExeWithExports)) {
          return linkExeWithExports;
        }
      }
      return "CMAKE_" + lang + "_LINK_EXECUTABLE";
    default:
      break;
  }
  return "";
}